

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void cdataBlockDebug(void *ctx,xmlChar *value,int len)

{
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.pcdata(%.20s, %d)\n",value,len);
  return;
}

Assistant:

static void
cdataBlockDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *value, int len)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.pcdata(%.20s, %d)\n",
	    (char *) value, len);
}